

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O3

void __thiscall kj::Thread::~Thread(Thread *this)

{
  int iVar1;
  ThreadState *pTVar2;
  Fault f;
  Fault local_170;
  Exception local_168;
  
  if (this->detached == false) {
    iVar1 = pthread_join(this->threadId,(void **)0x0);
    if (iVar1 != 0) {
      local_170.exception = (Exception *)0x0;
      local_168.ownFile.content.ptr = (char *)0x0;
      local_168.ownFile.content.size_ = 0;
      _::Debug::Fault::init
                (&local_170,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++"
                );
      _::Debug::Fault::~Fault(&local_170);
    }
    pTVar2 = this->state;
    if ((pTVar2->exception).ptr.isSet == true) {
      local_168.ownFile.content.ptr = (pTVar2->exception).ptr.field_1.value.ownFile.content.ptr;
      local_168.ownFile.content.size_ = (pTVar2->exception).ptr.field_1.value.ownFile.content.size_;
      local_168.ownFile.content.disposer =
           (pTVar2->exception).ptr.field_1.value.ownFile.content.disposer;
      (pTVar2->exception).ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (pTVar2->exception).ptr.field_1.value.ownFile.content.size_ = 0;
      local_168.file = (pTVar2->exception).ptr.field_1.value.file;
      local_168._32_8_ = *(undefined8 *)((long)&(pTVar2->exception).ptr.field_1 + 0x20);
      local_168.description.content.ptr =
           (pTVar2->exception).ptr.field_1.value.description.content.ptr;
      local_168.description.content.size_ =
           (pTVar2->exception).ptr.field_1.value.description.content.size_;
      (pTVar2->exception).ptr.field_1.value.description.content.ptr = (char *)0x0;
      (pTVar2->exception).ptr.field_1.value.description.content.size_ = 0;
      local_168.description.content.disposer =
           (pTVar2->exception).ptr.field_1.value.description.content.disposer;
      local_168.context.ptr.disposer = (pTVar2->exception).ptr.field_1.value.context.ptr.disposer;
      local_168.context.ptr.ptr = (pTVar2->exception).ptr.field_1.value.context.ptr.ptr;
      (pTVar2->exception).ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      memcpy(local_168.trace,(void *)((long)&(pTVar2->exception).ptr.field_1 + 0x50),0x104);
      pTVar2 = this->state;
      if ((pTVar2->exception).ptr.isSet == true) {
        (pTVar2->exception).ptr.isSet = false;
        Exception::~Exception(&(pTVar2->exception).ptr.field_1.value);
      }
      throwRecoverableException(&local_168,0);
      Exception::~Exception(&local_168);
      pTVar2 = this->state;
    }
    ThreadState::unref(pTVar2);
  }
  return;
}

Assistant:

Thread::~Thread() noexcept(false) {
  if (!detached) {
    KJ_DEFER(state->unref());

    int pthreadResult = pthread_join(*reinterpret_cast<pthread_t*>(&threadId), nullptr);
    if (pthreadResult != 0) {
      KJ_FAIL_SYSCALL("pthread_join", pthreadResult) { break; }
    }

    KJ_IF_MAYBE(e, state->exception) {
      Exception ecopy = kj::mv(*e);
      state->exception = nullptr;  // don't complain of uncaught exception when deleting
      kj::throwRecoverableException(kj::mv(ecopy));
    }
  }
}